

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

Endpoint * __thiscall
helics::MessageFederate::registerEndpoint
          (MessageFederate *this,string_view eptName,string_view type)

{
  MessageFederateManager *this_00;
  Endpoint *pEVar1;
  string_view name;
  string local_40;
  
  this_00 = (this->mfManager)._M_t.
            super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
            .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl;
  Federate::localNameGenerator_abi_cxx11_
            (&local_40,
             (Federate *)
             ((long)&this->_vptr_MessageFederate + (long)this->_vptr_MessageFederate[-3]),eptName);
  name._M_str = local_40._M_dataplus._M_p;
  name._M_len = local_40._M_string_length;
  pEVar1 = MessageFederateManager::registerEndpoint(this_00,name,(string_view)type);
  std::__cxx11::string::~string((string *)&local_40);
  return pEVar1;
}

Assistant:

Endpoint& MessageFederate::registerEndpoint(std::string_view eptName, std::string_view type)
{
    return mfManager->registerEndpoint(localNameGenerator(eptName), type);
}